

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O2

Url * __thiscall kj::Url::parseRelative(Url *__return_storage_ptr__,Url *this,StringPtr url)

{
  StringPtr url_local;
  NullableValue<kj::Url> local_2c8;
  NullableValue<kj::Url> _kj_result;
  NullableValue<kj::Url> local_f8;
  
  url_local.content.size_ = url.content.size_;
  url_local.content.ptr = url.content.ptr;
  tryParseRelative((Maybe<kj::Url> *)&local_2c8,this,url);
  _::NullableValue<kj::Url>::NullableValue(&_kj_result,&local_2c8);
  _::NullableValue<kj::Url>::~NullableValue(&local_2c8);
  if (_kj_result.isSet != false) {
    _::NullableValue<kj::Url>::NullableValue(&local_f8,&_kj_result);
    _::NullableValue<kj::Url>::~NullableValue(&_kj_result);
    Url(__return_storage_ptr__,&local_f8.field_1.value);
    _::NullableValue<kj::Url>::~NullableValue(&local_f8);
    return __return_storage_ptr__;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21],kj::StringPtr&>
            ((Fault *)&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/url.c++"
             ,0x117,FAILED,"tryParseRelative(url) != nullptr","\"invalid relative URL\", url",
             (char (*) [21])"invalid relative URL",&url_local);
  _::Debug::Fault::fatal((Fault *)&local_2c8);
}

Assistant:

Url Url::parseRelative(StringPtr url) const {
  return KJ_REQUIRE_NONNULL(tryParseRelative(url), "invalid relative URL", url);
}